

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void anon_unknown.dwarf_81614e::CreateGeneratedSource
               (cmLocalGenerator *lg,string *output,OutputRole role,cmCommandOrigin origin,
               cmListFileBacktrace *lfbt)

{
  cmake *pcVar1;
  bool bVar2;
  size_type sVar3;
  long lVar4;
  string sStack_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  sVar3 = cmGeneratorExpression::Find(output);
  if (sVar3 == 0xffffffffffffffff) {
    bVar2 = cmMakefile::CanIWriteThisFile(lg->Makefile,output);
    if (bVar2) {
      lVar4 = std::__cxx11::string::find_first_of((char *)output,0x7238e5);
      if (lVar4 == -1) {
        if (origin != Generator) {
          return;
        }
        cmMakefile::GetOrCreateGeneratedSource(lg->Makefile,output);
        return;
      }
      pcVar1 = lg->GlobalGenerator->CMakeInstance;
      local_38._M_len = (ulong)(role != Primary) * 4 + 6;
      local_38._M_str = "BYPRODUCTS";
      if (role == Primary) {
        local_38._M_str = "OUTPUT";
      }
      cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char_const(&)[16],char_const&,char_const(&)[18]>
                (&sStack_58,&local_38,(char (*) [16])0x741d8f,(output->_M_dataplus)._M_p + lVar4,
                 (char (*) [18])"\" is not allowed.");
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&sStack_58,lfbt);
    }
    else {
      pcVar1 = lg->GlobalGenerator->CMakeInstance;
      local_38._M_len = (ulong)(role != Primary) * 4 + 6;
      local_38._M_str = "BYPRODUCTS";
      if (role == Primary) {
        local_38._M_str = "OUTPUT";
      }
      cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char_const(&)[9],std::__cxx11::string_const&,char_const(&)[55]>
                (&sStack_58,&local_38,(char (*) [9])" path\n  ",output,
                 (char (*) [55])"\nin a source directory as an output of custom command.");
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&sStack_58,lfbt);
    }
  }
  else {
    pcVar1 = lg->GlobalGenerator->CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_58,
               "Generator expressions in custom command outputs are not implemented!",
               (allocator<char> *)&local_38);
    cmake::IssueMessage(pcVar1,FATAL_ERROR,&sStack_58,lfbt);
  }
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void CreateGeneratedSource(cmLocalGenerator& lg, const std::string& output,
                           cmLocalGenerator::OutputRole role,
                           cmCommandOrigin origin,
                           const cmListFileBacktrace& lfbt)
{
  if (cmGeneratorExpression::Find(output) != std::string::npos) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Generator expressions in custom command outputs are not implemented!",
      lfbt);
    return;
  }

  // Make sure the file will not be generated into the source
  // directory during an out of source build.
  if (!lg.GetMakefile()->CanIWriteThisFile(output)) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(CustomOutputRoleKeyword(role), " path\n  ", output,
               "\nin a source directory as an output of custom command."),
      lfbt);
    return;
  }

  // Make sure the output file name has no invalid characters.
  std::string::size_type pos = output.find_first_of("#<>");
  if (pos != std::string::npos) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(CustomOutputRoleKeyword(role), " containing a \"", output[pos],
               "\" is not allowed."),
      lfbt);
    return;
  }

  // Outputs without generator expressions from the project are already
  // created and marked as generated.  Do not mark them again, because
  // other commands might have overwritten the property.
  if (origin == cmCommandOrigin::Generator) {
    lg.GetMakefile()->GetOrCreateGeneratedSource(output);
  }
}